

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void av1_fill_lr_rates(ModeCosts *mode_costs,FRAME_CONTEXT *fc)

{
  int *in_RSI;
  aom_cdf_prob *in_RDI;
  int *unaff_retaddr;
  
  av1_cost_tokens_from_cdf(unaff_retaddr,in_RDI,in_RSI);
  av1_cost_tokens_from_cdf(unaff_retaddr,in_RDI,in_RSI);
  av1_cost_tokens_from_cdf(unaff_retaddr,in_RDI,in_RSI);
  return;
}

Assistant:

void av1_fill_lr_rates(ModeCosts *mode_costs, FRAME_CONTEXT *fc) {
  av1_cost_tokens_from_cdf(mode_costs->switchable_restore_cost,
                           fc->switchable_restore_cdf, NULL);
  av1_cost_tokens_from_cdf(mode_costs->wiener_restore_cost,
                           fc->wiener_restore_cdf, NULL);
  av1_cost_tokens_from_cdf(mode_costs->sgrproj_restore_cost,
                           fc->sgrproj_restore_cdf, NULL);
}